

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

Type metaf::CloudType::cloudTypeOrObscurationFromString(string *s)

{
  Type TVar1;
  int iVar2;
  
  TVar1 = cloudTypeFromString(s);
  if (TVar1 == NOT_REPORTED) {
    iVar2 = std::__cxx11::string::compare((char *)s);
    if (iVar2 == 0) {
      TVar1 = BLOWING_SNOW;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)s);
      if (iVar2 == 0) {
        TVar1 = BLOWING_DUST;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)s);
        if (iVar2 == 0) {
          TVar1 = BLOWING_SAND;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)s);
          if (iVar2 == 0) {
            TVar1 = ICE_CRYSTALS;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)s);
            if (iVar2 == 0) {
              TVar1 = RAIN;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)s);
              if (iVar2 == 0) {
                TVar1 = DRIZZLE;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)s);
                if (iVar2 == 0) {
                  TVar1 = SNOW;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)s);
                  if (iVar2 == 0) {
                    TVar1 = ICE_PELLETS;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)s);
                    if (iVar2 == 0) {
                      TVar1 = SMOKE;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)s);
                      if (iVar2 == 0) {
                        TVar1 = FOG;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare((char *)s);
                        if (iVar2 == 0) {
                          TVar1 = MIST;
                        }
                        else {
                          iVar2 = std::__cxx11::string::compare((char *)s);
                          if (iVar2 == 0) {
                            TVar1 = HAZE;
                          }
                          else {
                            iVar2 = std::__cxx11::string::compare((char *)s);
                            TVar1 = VOLCANIC_ASH;
                            if (iVar2 != 0) {
                              TVar1 = NOT_REPORTED;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar1;
}

Assistant:

CloudType::Type CloudType::cloudTypeOrObscurationFromString(const std::string & s) {
	if (const auto t = cloudTypeFromString(s); t != Type::NOT_REPORTED) return t;
	if (s == "BLSN")  return Type::BLOWING_SNOW;
	if (s == "BLDU")  return Type::BLOWING_DUST;
	if (s == "BLSA")  return Type::BLOWING_SAND;
	if (s == "IC")    return Type::ICE_CRYSTALS;
	if (s == "RA")    return Type::RAIN;
	if (s == "DZ")    return Type::DRIZZLE;
	if (s == "SN")    return Type::SNOW;
	if (s == "PL")    return Type::ICE_PELLETS;
	if (s == "FU")    return Type::SMOKE;
	if (s == "FG")    return Type::FOG;
	if (s == "BR")    return Type::MIST;
	if (s == "HZ")    return Type::HAZE;
	if (s == "VA") 	  return Type::VOLCANIC_ASH;
	return Type::NOT_REPORTED;
}